

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

void fy_emit_node_comment
               (fy_emitter *emit,fy_node *fyn,int flags,int indent,fy_comment_placement placement)

{
  fy_token *fyt;
  int flags_00;
  
  if ((placement < fycp_max) &&
     ((emit->cfg->flags & FYECF_OUTPUT_COMMENTS) != FYECF_DOC_END_MARK_AUTO)) {
    fyt = fy_node_value_token(fyn);
    if (fyt != (fy_token *)0x0) {
      fy_emit_token_comment(emit,fyt,flags_00,indent,placement);
      return;
    }
  }
  return;
}

Assistant:

void fy_emit_node_comment(struct fy_emitter *emit, struct fy_node *fyn, int flags, int indent,
                          enum fy_comment_placement placement) {
    struct fy_token *fyt;

    if (!fy_emit_output_comments(emit) || (unsigned int) placement >= fycp_max)
        return;

    fyt = fy_node_value_token(fyn);
    if (!fyt)
        return;

    fy_emit_token_comment(emit, fyt, flags, indent, placement);
}